

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_FilePathUtils.cpp
# Opt level: O2

String * axl::io::getFileName(String *__return_storage_ptr__,StringRef *filePath)

{
  size_t sVar1;
  StringRef local_30;
  
  sVar1 = sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::reverseFind
                    (filePath,'/',0xffffffffffffffff);
  if (sVar1 == 0xffffffffffffffff) {
    sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase(&local_30,filePath);
  }
  else {
    sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::getSubString
              (&local_30,filePath,sVar1 + 1,0xffffffffffffffff);
  }
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::StringBase
            (__return_storage_ptr__,&local_30);
  sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase(&local_30);
  return __return_storage_ptr__;
}

Assistant:

sl::String
getFileName(const sl::StringRef& filePath) {
#if (_AXL_OS_WIN)
	char buffer[256];
	sl::String_w filePath_w(rc::BufKind_Stack, buffer, sizeof(buffer));
	filePath_w = filePath;

	wchar_t fileName[1024] = { 0 };
	wchar_t extension[1024] = { 0 };

	_wsplitpath_s(
		filePath_w,
		NULL, 0,
		NULL, 0,
		fileName, countof(fileName) - 1,
		extension, countof(extension) - 1
	);

	sl::String string = fileName;
	string.append(extension);
	return string;
#elif (_AXL_OS_POSIX)
	size_t i = filePath.reverseFind('/');
	return i != -1 ? filePath.getSubString(i + 1) : filePath;
#endif
}